

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::LabelTests_PrintHieroLexicalMulti_Test::TestBody
          (LabelTests_PrintHieroLexicalMulti_Test *this)

{
  bool bVar1;
  char *message;
  char *in_RCX;
  string_view line;
  AssertHelper local_2b8;
  Message local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined1 local_288 [8];
  AssertionResult gtest_ar;
  PhrasalRule rule;
  ostringstream local_1e0 [8];
  ostringstream s;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  AlignedSentencePair asp;
  LabelTests_PrintHieroLexicalMulti_Test *this_local;
  
  asp.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"a\tb c d\t0-0");
  line._M_str = in_RCX;
  line._M_len = (size_t)local_68._M_str;
  readAlignedSentencePair<false,false>
            ((AlignedSentencePair *)local_58,(thrax *)local_68._M_len,line);
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  PhrasalRule::PhrasalRule((PhrasalRule *)&gtest_ar.message_,(AlignedSentencePair *)local_58);
  thrax::operator<<((ostream *)local_1e0,(PhrasalRule *)&gtest_ar.message_);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[16],std::__cxx11::string>
            ((EqHelper<false> *)local_288,"\"[X]\\ta\\tb c d\\t0-0\"","s.str()",
             (char (*) [16])"[X]\ta\tb c d\t0-0",&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x1c,message);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_58);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroLexicalMulti) {
  auto asp = readAlignedSentencePair<false, false>("a\tb c d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  s << rule;
  EXPECT_EQ("[X]\ta\tb c d\t0-0", s.str());
}